

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_153ab3::Db::parseName(Db *this,NameState *State)

{
  char cVar1;
  NameWithTemplateArgs *pNVar2;
  Node *local_40;
  Node *TA_1;
  Node *N;
  Node *TA;
  Node *S;
  NameState *State_local;
  Db *this_local;
  
  S = (Node *)State;
  State_local = (NameState *)this;
  consumeIf(this,'L');
  cVar1 = look(this,0);
  if (cVar1 == 'N') {
    this_local = (Db *)parseNestedName(this,(NameState *)S);
  }
  else {
    cVar1 = look(this,0);
    if (cVar1 == 'Z') {
      this_local = (Db *)parseLocalName(this,(NameState *)S);
    }
    else {
      cVar1 = look(this,0);
      if ((cVar1 == 'S') && (cVar1 = look(this,1), cVar1 != 't')) {
        TA = parseSubstitution(this);
        if (TA == (Node *)0x0) {
          return (Node *)0x0;
        }
        cVar1 = look(this,0);
        if (cVar1 != 'I') {
          return (Node *)0x0;
        }
        N = parseTemplateArgs(this,S != (Node *)0x0);
        if (N == (Node *)0x0) {
          return (Node *)0x0;
        }
        if (S != (Node *)0x0) {
          *(undefined1 *)((long)&S->_vptr_Node + 1) = 1;
        }
        pNVar2 = (anonymous_namespace)::Db::
                 make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                           ((Db *)this,&TA,&N);
        return &pNVar2->super_Node;
      }
      TA_1 = parseUnscopedName(this,(NameState *)S);
      if (TA_1 == (Node *)0x0) {
        this_local = (Db *)0x0;
      }
      else {
        cVar1 = look(this,0);
        if (cVar1 == 'I') {
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Subs,&TA_1);
          local_40 = parseTemplateArgs(this,S != (Node *)0x0);
          if (local_40 == (Node *)0x0) {
            this_local = (Db *)0x0;
          }
          else {
            if (S != (Node *)0x0) {
              *(undefined1 *)((long)&S->_vptr_Node + 1) = 1;
            }
            this_local = (Db *)(anonymous_namespace)::Db::
                               make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                                         ((Db *)this,&TA_1,&local_40);
          }
        }
        else {
          this_local = (Db *)TA_1;
        }
      }
    }
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseName(NameState *State) {
  consumeIf('L'); // extension

  if (look() == 'N')
    return parseNestedName(State);
  if (look() == 'Z')
    return parseLocalName(State);

  //        ::= <unscoped-template-name> <template-args>
  if (look() == 'S' && look(1) != 't') {
    Node *S = parseSubstitution();
    if (S == nullptr)
      return nullptr;
    if (look() != 'I')
      return nullptr;
    Node *TA = parseTemplateArgs(State != nullptr);
    if (TA == nullptr)
      return nullptr;
    if (State) State->EndsWithTemplateArgs = true;
    return make<NameWithTemplateArgs>(S, TA);
  }

  Node *N = parseUnscopedName(State);
  if (N == nullptr)
    return nullptr;
  //        ::= <unscoped-template-name> <template-args>
  if (look() == 'I') {
    Subs.push_back(N);
    Node *TA = parseTemplateArgs(State != nullptr);
    if (TA == nullptr)
      return nullptr;
    if (State) State->EndsWithTemplateArgs = true;
    return make<NameWithTemplateArgs>(N, TA);
  }
  //        ::= <unscoped-name>
  return N;
}